

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O2

void __thiscall
cimod::BinaryPolynomialModel<int,_double>::BinaryPolynomialModel
          (BinaryPolynomialModel<int,_double> *this,vector<int,_std::allocator<int>_> *variables,
          PolynomialKeyList<std::size_t> *poly_key_distance_list,
          PolynomialValueList<double> *poly_value_list,Vartype vartype)

{
  PolynomialKeyList<int> *pPVar1;
  pointer pvVar2;
  pointer puVar3;
  pointer pvVar4;
  pointer piVar5;
  BinaryPolynomialModel<int,_double> *this_00;
  size_type __new_size;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  runtime_error *this_01;
  size_t i;
  PolynomialKeyList<std::size_t> *pPVar8;
  int *it_1;
  key_type *__k;
  size_type sVar9;
  unsigned_long *it;
  pointer puVar10;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  PolynomialKeyList<int> *local_b0;
  PolynomialValueList<double> *local_a8;
  BinaryPolynomialModel<int,_double> *local_a0;
  _Map_base<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_98;
  PolynomialKeyList<std::size_t> *local_90;
  PolynomialValueList<double> *local_88;
  size_type local_80;
  size_type local_78;
  size_type local_70;
  vector<int,_std::allocator<int>_> temp;
  
  (this->variables_)._M_h._M_buckets = &(this->variables_)._M_h._M_single_bucket;
  (this->variables_)._M_h._M_bucket_count = 1;
  (this->variables_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->variables_)._M_h._M_element_count = 0;
  (this->variables_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->variables_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->variables_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->each_variable_num_)._M_h._M_buckets = &(this->each_variable_num_)._M_h._M_single_bucket;
  (this->each_variable_num_)._M_h._M_bucket_count = 1;
  (this->each_variable_num_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->each_variable_num_)._M_h._M_element_count = 0;
  (this->each_variable_num_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->each_variable_num_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->each_variable_num_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->variables_to_integers_)._M_h._M_buckets =
       &(this->variables_to_integers_)._M_h._M_single_bucket;
  (this->variables_to_integers_)._M_h._M_bucket_count = 1;
  (this->variables_to_integers_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->variables_to_integers_)._M_h._M_element_count = 0;
  (this->variables_to_integers_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->variables_to_integers_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->variables_to_integers_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sorted_variables_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sorted_variables_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sorted_variables_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->relabel_flag_for_variables_to_integers_ = true;
  pPVar1 = &this->poly_key_list_;
  local_a8 = &this->poly_value_list_;
  local_98 = (_Map_base<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&this->poly_key_inv_;
  (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->poly_key_list_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->poly_key_list_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->poly_key_list_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->poly_key_inv_)._M_h._M_buckets = &(this->poly_key_inv_)._M_h._M_single_bucket;
  (this->poly_key_inv_)._M_h._M_bucket_count = 1;
  (this->poly_key_inv_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->poly_key_inv_)._M_h._M_element_count = 0;
  (this->poly_key_inv_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->poly_key_inv_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->poly_key_inv_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->vartype_ = vartype;
  local_b0 = pPVar1;
  if (vartype == NONE) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Unknown vartype detected");
  }
  else {
    local_88 = poly_value_list;
    if (((long)(poly_key_distance_list->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
        (long)(poly_key_distance_list->
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start) / 0x18 ==
        (long)(poly_value_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(poly_value_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3) {
      local_90 = poly_key_distance_list;
      std::
      _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::_Hashtable<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&temp,(variables->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start,
                 (variables->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish,0,&local_b1,&local_b2,&local_b3);
      std::
      _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::operator=((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)this,(_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)&temp);
      std::
      _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&temp);
      pPVar8 = local_90;
      if ((this->variables_)._M_h._M_element_count ==
          (long)(variables->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(variables->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2) {
        __new_size = ((long)(local_90->
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_90->
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x18;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::resize(pPVar1,__new_size);
        std::vector<double,_std::allocator<double>_>::resize(local_a8,__new_size);
        sVar9 = 0;
        local_78 = 0;
        if (0 < (long)__new_size) {
          local_78 = __new_size;
        }
        local_a0 = this;
        local_80 = __new_size;
        for (; this_00 = local_a0, pPVar1 = local_b0, sVar9 != local_78; sVar9 = sVar9 + 1) {
          temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          pvVar2 = (pPVar8->
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          puVar3 = *(pointer *)
                    ((long)&pvVar2[sVar9].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data + 8);
          local_70 = sVar9;
          for (puVar10 = pvVar2[sVar9].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start; puVar10 != puVar3; puVar10 = puVar10 + 1)
          {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       &temp.super__Vector_base<int,_std::allocator<int>_>,
                       (variables->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + *puVar10);
          }
          std::
          __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          std::vector<int,_std::allocator<int>_>::operator=
                    ((local_b0->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + sVar9,
                     (vector<int,_std::allocator<int>_> *)
                     &temp.super__Vector_base<int,_std::allocator<int>_>);
          sVar9 = local_70;
          (local_a8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[local_70] =
               (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[local_70];
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&temp.super__Vector_base<int,_std::allocator<int>_>);
          pPVar8 = local_90;
        }
        for (sVar9 = 0; sVar9 != local_80; sVar9 = sVar9 + 1) {
          pmVar6 = std::__detail::
                   _Map_base<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[](local_98,(pPVar1->
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + sVar9);
          *pmVar6 = sVar9;
          pvVar4 = (pPVar1->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar5 = *(pointer *)
                    ((long)&pvVar4[sVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data + 8);
          for (__k = pvVar4[sVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; __k != piVar5; __k = __k + 1) {
            pmVar7 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&this->each_variable_num_,__k);
            *pmVar7 = *pmVar7 + 1;
          }
        }
        UpdateVariablesToIntegers(this_00);
        return;
      }
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_01,
                 "Unknown error. It seems that the input variables contain the same variables");
    }
    else {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_01,"The sizes of key_list and value_list must match each other");
    }
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

BinaryPolynomialModel(
        const std::vector<IndexType> &variables,
        const PolynomialKeyList<std::size_t> &poly_key_distance_list,
        const PolynomialValueList<FloatType> &poly_value_list,
        const Vartype vartype ) :
        vartype_( vartype ) {
      if ( vartype_ == Vartype::NONE ) {
        throw std::runtime_error( "Unknown vartype detected" );
      }

      if ( poly_key_distance_list.size() != poly_value_list.size() ) {
        throw std::runtime_error( "The sizes of key_list and value_list must match each other" );
      }

      variables_ = std::unordered_set<IndexType>( variables.begin(), variables.end() );

      if ( variables_.size() != variables.size() ) {
        throw std::runtime_error( "Unknown error. It seems that the input variables contain the same variables" );
      }

      std::size_t num_interactions = poly_key_distance_list.size();
      poly_key_list_.resize( num_interactions );
      poly_value_list_.resize( num_interactions );

#pragma omp parallel for
      for ( int64_t i = 0; i < ( int64_t )num_interactions; ++i ) {
        std::vector<IndexType> temp;
        for ( const auto &it : poly_key_distance_list[ i ] ) {
          temp.push_back( variables[ it ] );
        }
        std::sort( temp.begin(), temp.end() );
        poly_key_list_[ i ] = temp;
        poly_value_list_[ i ] = poly_value_list[ i ];
      }

      for ( std::size_t i = 0; i < num_interactions; ++i ) {
        poly_key_inv_[ poly_key_list_[ i ] ] = i;
        for ( const auto &it : poly_key_list_[ i ] ) {
          each_variable_num_[ it ]++;
        }
      }

      UpdateVariablesToIntegers();
    }